

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgList.h
# Opt level: O2

dgListNode * __thiscall dgList<dgConvexHull3DFace>::Append(dgList<dgConvexHull3DFace> *this)

{
  dgListNode *pdVar1;
  dgListNode *this_00;
  
  this->m_count = this->m_count + 1;
  pdVar1 = this->m_first;
  this_00 = (dgListNode *)malloc(0x40);
  if (pdVar1 == (dgListNode *)0x0) {
    this_00->_vptr_dgListNode = (_func_int **)&PTR__dgListNode_0118e9a0;
    dgConvexHull3DFace::dgConvexHull3DFace(&this_00->m_info);
    this_00->m_next = (dgListNode *)0x0;
    this_00->m_prev = (dgListNode *)0x0;
    this->m_first = this_00;
  }
  else {
    dgListNode::dgListNode(this_00,this->m_last,(dgListNode *)0x0);
  }
  this->m_last = this_00;
  return this_00;
}

Assistant:

typename dgList<T>::dgListNode *dgList<T>::Append ()
{
	m_count	++;
	if (m_first == NULL) {
		m_first = HACD_NEW(dgListNode)(NULL, NULL);
		m_last = m_first;
	} else {
		m_last = HACD_NEW(dgListNode)(m_last, NULL);
	}
#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif
	return m_last;
}